

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

char * cppcms_capi_error_clear(cppcms_capi_object obj)

{
  char *pcVar1;
  undefined4 *in_RDI;
  char *r;
  
  pcVar1 = cppcms_capi_error_message(in_RDI);
  if (in_RDI != (undefined4 *)0x0) {
    *in_RDI = 0;
  }
  return pcVar1;
}

Assistant:

char const *cppcms_capi_error_clear(cppcms_capi_object obj)
{
	char const *r=cppcms_capi_error_message(obj);
	if(obj) {
		static_cast<cppcms_capi_exception *>(obj)->code = 0;
	}
	return r;
}